

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::JoinCommonEdges(Clipper *this,bool fixHoleLinkages)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  value_type pJVar4;
  IntPoint pt2b;
  IntPoint pt3_00;
  IntPoint pt3_01;
  IntPoint pt2a;
  IntPoint pt1b;
  IntPoint pt1a;
  IntPoint pt1_00;
  bool bVar5;
  bool bVar6;
  JoinRec *pJVar7;
  reference ppJVar8;
  reference ppOVar9;
  OutPt *pOVar10;
  size_type sVar11;
  JoinRec *pJVar12;
  long64 lVar13;
  double dVar14;
  IntPoint pt;
  IntPoint pt_00;
  IntPoint pt_01;
  IntPoint pt_02;
  IntPoint pt_03;
  IntPoint pt_04;
  IntPoint pt_05;
  IntPoint pt_06;
  JoinRec *j2_1;
  size_type k_1;
  int ObsoleteIdx;
  int OKIdx;
  JoinRec *j2;
  size_type k;
  OutPt *prev;
  OutPt *p4;
  OutPt *p3;
  OutPt *p2;
  OutPt *p1;
  undefined1 local_90 [8];
  IntPoint pt4;
  IntPoint pt3;
  IntPoint pt2;
  IntPoint pt1;
  OutPt *pp2a;
  OutRec *outRec2;
  OutPt *pp1a;
  OutRec *outRec1;
  JoinRec *j;
  size_type i;
  Clipper *pCStack_18;
  bool fixHoleLinkages_local;
  Clipper *this_local;
  
  j = (JoinRec *)0x0;
  i._7_1_ = fixHoleLinkages;
  pCStack_18 = this;
  do {
    pJVar12 = j;
    pJVar7 = (JoinRec *)
             std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::size
                       (&this->m_Joins);
    if (pJVar7 <= pJVar12) {
      return;
    }
    ppJVar8 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>::operator[]
                        (&this->m_Joins,(size_type)j);
    outRec1 = (OutRec *)*ppJVar8;
    ppOVar9 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,(long)((value_type)outRec1)->poly1Idx);
    pp1a = (OutPt *)*ppOVar9;
    outRec2 = (OutRec *)((value_type)pp1a)->pts;
    ppOVar9 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::operator[]
                        (&this->m_PolyOuts,(long)*(int *)&outRec1[1].AppendLink);
    pp2a = (OutPt *)*ppOVar9;
    pt1.Y = (long64)((value_type)pp2a)->pts;
    pt2.Y = (long64)outRec1->bottomFlag;
    pt1.X = *(long64 *)&outRec1->sides;
    pt3.Y._0_4_ = outRec1[1].idx;
    pt3.Y._4_1_ = outRec1[1].isHole;
    pt3.Y._5_3_ = *(undefined3 *)&outRec1[1].field_0x5;
    pt2.X = (long64)outRec1[1].FirstLeft;
    pt4.Y._0_4_ = outRec1->idx;
    pt4.Y._4_1_ = outRec1->isHole;
    pt4.Y._5_3_ = *(undefined3 *)&outRec1->field_0x5;
    pt3.X = (long64)outRec1->FirstLeft;
    local_90 = (undefined1  [8])outRec1->AppendLink;
    pt4.X = (long64)outRec1->pts;
    bVar5 = FindSegment((OutPt **)&outRec2,(IntPoint *)&pt2.Y,(IntPoint *)&pt3.Y);
    if (bVar5) {
      if (*(int *)&outRec1->bottomPt == *(int *)&outRec1[1].AppendLink) {
        pt1.Y = (long64)outRec2->pts;
        bVar5 = FindSegment((OutPt **)&pt1.Y,(IntPoint *)&pt4.Y,(IntPoint *)local_90);
        if ((bVar5) && ((OutRec *)pt1.Y != outRec2)) {
LAB_00b547dc:
          pt1a.Y = pt1.X;
          pt1a.X = pt2.Y;
          pt1b.Y = pt2.X;
          pt1b.X = pt3.Y;
          pt2a.Y = pt3.X;
          pt2a.X = pt4.Y;
          pt2b.Y = pt4.X;
          pt2b.X = (long64)local_90;
          lVar13 = pt4.Y;
          bVar5 = GetOverlapSegment(pt1a,pt1b,pt2a,pt2b,(IntPoint *)&pt2.Y,(IntPoint *)&pt3.Y);
          if (bVar5) {
            p3 = outRec2->bottomPt;
            bVar5 = PointsEqual((IntPoint *)&outRec2->FirstLeft,(IntPoint *)&pt2.Y);
            if (bVar5) {
              p2 = (OutPt *)outRec2;
            }
            else {
              bVar5 = PointsEqual(&p3->pt,(IntPoint *)&pt2.Y);
              p2 = p3;
              if (!bVar5) {
                pt.Y = lVar13;
                pt.X = pt1.X;
                p2 = InsertPolyPtBetween((ClipperLib *)outRec2,p3,(OutPt *)pt2.Y,pt);
              }
            }
            bVar5 = PointsEqual((IntPoint *)&outRec2->FirstLeft,(IntPoint *)&pt3.Y);
            if (bVar5) {
              p3 = (OutPt *)outRec2;
            }
            else {
              bVar5 = PointsEqual(&p3->pt,(IntPoint *)&pt3.Y);
              if (!bVar5) {
                if (((OutRec *)p2 == outRec2) || (p2 == p3)) {
                  pt_00.Y = lVar13;
                  pt_00.X = pt2.X;
                  p3 = InsertPolyPtBetween((ClipperLib *)outRec2,p3,(OutPt *)pt3.Y,pt_00);
                }
                else {
                  pt1_00.X = (long64)outRec2->FirstLeft;
                  pt1_00.Y = (long64)outRec2->AppendLink;
                  pt3_01.Y = pt2.X;
                  pt3_01.X = pt3.Y;
                  lVar13 = pt3.Y;
                  bVar5 = Pt3IsBetweenPt1AndPt2(pt1_00,p2->pt,pt3_01);
                  if (bVar5) {
                    pt_01.Y = lVar13;
                    pt_01.X = pt2.X;
                    p3 = InsertPolyPtBetween((ClipperLib *)outRec2,p2,(OutPt *)pt3.Y,pt_01);
                  }
                  else {
                    pt_02.Y = lVar13;
                    pt_02.X = pt2.X;
                    p3 = InsertPolyPtBetween((ClipperLib *)p2,p3,(OutPt *)pt3.Y,pt_02);
                  }
                }
              }
            }
            prev = *(OutPt **)(pt1.Y + 0x20);
            bVar5 = PointsEqual((IntPoint *)(pt1.Y + 8),(IntPoint *)&pt2.Y);
            if (bVar5) {
              p4 = (OutPt *)pt1.Y;
            }
            else {
              bVar5 = PointsEqual(&prev->pt,(IntPoint *)&pt2.Y);
              p4 = prev;
              if (!bVar5) {
                pt_03.Y = lVar13;
                pt_03.X = pt1.X;
                p4 = InsertPolyPtBetween((ClipperLib *)pt1.Y,prev,(OutPt *)pt2.Y,pt_03);
              }
            }
            bVar5 = PointsEqual((IntPoint *)(pt1.Y + 8),(IntPoint *)&pt3.Y);
            if (bVar5) {
              prev = (OutPt *)pt1.Y;
            }
            else {
              bVar5 = PointsEqual(&prev->pt,(IntPoint *)&pt3.Y);
              if (!bVar5) {
                if ((p4 == (OutPt *)pt1.Y) || (p4 == prev)) {
                  pt_04.Y = lVar13;
                  pt_04.X = pt2.X;
                  prev = InsertPolyPtBetween((ClipperLib *)pt1.Y,prev,(OutPt *)pt3.Y,pt_04);
                }
                else {
                  pt3_00.Y = pt2.X;
                  pt3_00.X = pt3.Y;
                  lVar13 = pt3.Y;
                  bVar5 = Pt3IsBetweenPt1AndPt2(*(IntPoint *)(pt1.Y + 8),p4->pt,pt3_00);
                  if (bVar5) {
                    pt_05.Y = lVar13;
                    pt_05.X = pt2.X;
                    prev = InsertPolyPtBetween((ClipperLib *)pt1.Y,p4,(OutPt *)pt3.Y,pt_05);
                  }
                  else {
                    pt_06.Y = lVar13;
                    pt_06.X = pt2.X;
                    prev = InsertPolyPtBetween((ClipperLib *)p4,prev,(OutPt *)pt3.Y,pt_06);
                  }
                }
              }
            }
            if ((p2->next == p3) && (p4->prev == prev)) {
              p2->next = p4;
              p4->prev = p2;
              p3->prev = prev;
              prev->next = p3;
            }
            else {
              if ((p2->prev != p3) || (p4->next != prev)) goto LAB_00b554a0;
              p2->prev = p4;
              p4->next = p2;
              p3->next = prev;
              prev->prev = p3;
            }
            if (*(int *)&outRec1[1].AppendLink == *(int *)&outRec1->bottomPt) {
              pOVar10 = GetBottomPt(p2);
              pp1a->next = pOVar10;
              pp1a->prev = pp1a->next;
              pp1a->prev->idx = pp1a->idx;
              pp2a = (OutPt *)CreateOutRec(this);
              std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::push_back
                        (&this->m_PolyOuts,(value_type *)&pp2a);
              sVar11 = std::vector<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>::
                       size(&this->m_PolyOuts);
              pp2a->idx = (int)sVar11 + -1;
              *(int *)&outRec1[1].AppendLink = pp2a->idx;
              pOVar10 = GetBottomPt(p3);
              pp2a->next = pOVar10;
              pp2a->prev = pp2a->next;
              pp2a->prev->idx = pp2a->idx;
              bVar5 = PointInPolygon(&pp2a->next->pt,pp1a->next,
                                     (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                  [(long)&(this->m_PolyOuts).
                                                                                                                    
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ] & 1));
              if (bVar5) {
                pp2a->field_0x4 = (pp1a->field_0x4 ^ 0xff) & 1;
                (pp2a->pt).X = (long64)pp1a;
                bVar1 = pp2a->field_0x4;
                bVar5 = this->m_ReverseOutput;
                bVar6 = Orientation((OutRec *)pp2a,
                                    (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                 [(long)&(this->m_PolyOuts).
                                                                                                                  
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                 ] & 1));
                j2 = j;
                if ((bVar1 & 1) == (bVar5 & 1U ^ bVar6)) {
                  ReversePolyPtLinks(pp2a->next);
                  j2 = j;
                }
              }
              else {
                bVar5 = PointInPolygon(&pp1a->next->pt,pp2a->next,
                                       (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                    [(long)&(this->m_PolyOuts).
                                                                                                                        
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ] & 1));
                if (bVar5) {
                  pp2a->field_0x4 = pp1a->field_0x4 & 1;
                  pp1a->field_0x4 = (pp2a->field_0x4 ^ 0xff) & 1;
                  (pp2a->pt).X = (pp1a->pt).X;
                  (pp1a->pt).X = (long64)pp2a;
                  bVar1 = pp1a->field_0x4;
                  bVar5 = this->m_ReverseOutput;
                  bVar6 = Orientation((OutRec *)pp1a,
                                      (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                   [(long)&(this->m_PolyOuts).
                                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                  ] & 1));
                  if ((bVar1 & 1) == (bVar5 & 1U ^ bVar6)) {
                    ReversePolyPtLinks(pp1a->next);
                  }
                  j2 = j;
                  if ((i._7_1_ & 1) != 0) {
                    CheckHoleLinkages1(this,(OutRec *)pp1a,(OutRec *)pp2a);
                    j2 = j;
                  }
                }
                else {
                  pp2a->field_0x4 = pp1a->field_0x4 & 1;
                  (pp2a->pt).X = (pp1a->pt).X;
                  j2 = j;
                  if ((i._7_1_ & 1) != 0) {
                    CheckHoleLinkages1(this,(OutRec *)pp1a,(OutRec *)pp2a);
                    j2 = j;
                  }
                }
              }
              while( true ) {
                j2 = (JoinRec *)((long)&(j2->pt1a).X + 1);
                pJVar12 = (JoinRec *)
                          std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                          ::size(&this->m_Joins);
                if (pJVar12 <= j2) break;
                ppJVar8 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                          ::operator[](&this->m_Joins,(size_type)j2);
                pJVar4 = *ppJVar8;
                if ((pJVar4->poly1Idx == *(int *)&outRec1->bottomPt) &&
                   (bVar5 = PointIsVertex(&pJVar4->pt1a,p3), bVar5)) {
                  pJVar4->poly1Idx = *(int *)&outRec1[1].AppendLink;
                }
                if ((pJVar4->poly2Idx == *(int *)&outRec1->bottomPt) &&
                   (bVar5 = PointIsVertex(&pJVar4->pt2a,p3), bVar5)) {
                  pJVar4->poly2Idx = *(int *)&outRec1[1].AppendLink;
                }
              }
              FixupOutPolygon(this,(OutRec *)pp1a);
              FixupOutPolygon(this,(OutRec *)pp2a);
              if (pp1a->next != (OutPt *)0x0) {
                bVar5 = Orientation((OutRec *)pp1a,
                                    (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                 [(long)&(this->m_PolyOuts).
                                                                                                                  
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                 ] & 1));
                dVar14 = Area((OutRec *)pp1a,
                              (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                           [(long)&(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                           ] & 1));
                if (bVar5 != 0.0 < dVar14) {
                  DisposeBottomPt(this,(OutRec *)pp1a);
                }
              }
              if (pp2a->next != (OutPt *)0x0) {
                bVar5 = Orientation((OutRec *)pp2a,
                                    (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                 [(long)&(this->m_PolyOuts).
                                                                                                                  
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                 ] & 1));
                dVar14 = Area((OutRec *)pp2a,
                              (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                           [(long)&(this->m_PolyOuts).
                                                                                                      
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                           ] & 1));
                if (bVar5 != 0.0 < dVar14) {
                  DisposeBottomPt(this,(OutRec *)pp2a);
                }
              }
            }
            else {
              if ((i._7_1_ & 1) != 0) {
                CheckHoleLinkages2(this,(OutRec *)pp1a,(OutRec *)pp2a);
              }
              FixupOutPolygon(this,(OutRec *)pp1a);
              if (pp1a->next != (OutPt *)0x0) {
                bVar5 = Orientation((OutRec *)pp1a,
                                    (bool)((byte)(this->_vptr_Clipper[-3] + 0x10)
                                                 [(long)&(this->m_PolyOuts).
                                                                                                                  
                                                  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>
                                                 ] & 1));
                pp1a->field_0x4 = (bVar5 ^ 0xffU) & 1;
                if (((pp1a->field_0x4 & 1) != 0) && ((pp1a->pt).X == 0)) {
                  (pp1a->pt).X = (pp2a->pt).X;
                }
              }
              iVar2 = pp1a->idx;
              iVar3 = pp2a->idx;
              pp2a->next = (OutPt *)0x0;
              pp2a->prev = (OutPt *)0x0;
              (pp2a->pt).Y = (long64)pp1a;
              j2_1 = j;
              while( true ) {
                j2_1 = (JoinRec *)((long)&(j2_1->pt1a).X + 1);
                pJVar12 = (JoinRec *)
                          std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                          ::size(&this->m_Joins);
                if (pJVar12 <= j2_1) break;
                ppJVar8 = std::vector<ClipperLib::JoinRec_*,_std::allocator<ClipperLib::JoinRec_*>_>
                          ::operator[](&this->m_Joins,(size_type)j2_1);
                pJVar4 = *ppJVar8;
                if (pJVar4->poly1Idx == iVar3) {
                  pJVar4->poly1Idx = iVar2;
                }
                if (pJVar4->poly2Idx == iVar3) {
                  pJVar4->poly2Idx = iVar2;
                }
              }
            }
          }
        }
      }
      else {
        bVar5 = FindSegment((OutPt **)&pt1.Y,(IntPoint *)&pt4.Y,(IntPoint *)local_90);
        if (bVar5) goto LAB_00b547dc;
      }
    }
LAB_00b554a0:
    j = (JoinRec *)((long)&(j->pt1a).X + 1);
  } while( true );
}

Assistant:

void Clipper::JoinCommonEdges(bool fixHoleLinkages)
{
  for (JoinList::size_type i = 0; i < m_Joins.size(); i++)
  {
    JoinRec* j = m_Joins[i];
    OutRec *outRec1 = m_PolyOuts[j->poly1Idx];
    OutPt *pp1a = outRec1->pts;
    OutRec *outRec2 = m_PolyOuts[j->poly2Idx];
    OutPt *pp2a = outRec2->pts;
    IntPoint pt1 = j->pt2a, pt2 = j->pt2b;
    IntPoint pt3 = j->pt1a, pt4 = j->pt1b;
    if (!FindSegment(pp1a, pt1, pt2)) continue;
    if (j->poly1Idx == j->poly2Idx)
    {
      //we're searching the same polygon for overlapping segments so
      //segment 2 mustn't be the same as segment 1 ...
      pp2a = pp1a->next;
      if (!FindSegment(pp2a, pt3, pt4) || (pp2a == pp1a)) continue;
    }
    else if (!FindSegment(pp2a, pt3, pt4)) continue;

    if (!GetOverlapSegment(pt1, pt2, pt3, pt4, pt1, pt2)) continue;

    OutPt *p1, *p2, *p3, *p4;
    OutPt *prev = pp1a->prev;
    //get p1 & p2 polypts - the overlap start & endpoints on poly1
    if (PointsEqual(pp1a->pt, pt1)) p1 = pp1a;
    else if (PointsEqual(prev->pt, pt1)) p1 = prev;
    else p1 = InsertPolyPtBetween(pp1a, prev, pt1);

    if (PointsEqual(pp1a->pt, pt2)) p2 = pp1a;
    else if (PointsEqual(prev->pt, pt2)) p2 = prev;
    else if ((p1 == pp1a) || (p1 == prev))
      p2 = InsertPolyPtBetween(pp1a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp1a->pt, p1->pt, pt2))
      p2 = InsertPolyPtBetween(pp1a, p1, pt2); else
      p2 = InsertPolyPtBetween(p1, prev, pt2);

    //get p3 & p4 polypts - the overlap start & endpoints on poly2
    prev = pp2a->prev;
    if (PointsEqual(pp2a->pt, pt1)) p3 = pp2a;
    else if (PointsEqual(prev->pt, pt1)) p3 = prev;
    else p3 = InsertPolyPtBetween(pp2a, prev, pt1);

    if (PointsEqual(pp2a->pt, pt2)) p4 = pp2a;
    else if (PointsEqual(prev->pt, pt2)) p4 = prev;
    else if ((p3 == pp2a) || (p3 == prev))
      p4 = InsertPolyPtBetween(pp2a, prev, pt2);
    else if (Pt3IsBetweenPt1AndPt2(pp2a->pt, p3->pt, pt2))
      p4 = InsertPolyPtBetween(pp2a, p3, pt2); else
      p4 = InsertPolyPtBetween(p3, prev, pt2);

    //p1.pt == p3.pt and p2.pt == p4.pt so join p1 to p3 and p2 to p4 ...
    if (p1->next == p2 && p3->prev == p4)
    {
      p1->next = p3;
      p3->prev = p1;
      p2->prev = p4;
      p4->next = p2;
    }
    else if (p1->prev == p2 && p3->next == p4)
    {
      p1->prev = p3;
      p3->next = p1;
      p2->next = p4;
      p4->prev = p2;
    }
    else
      continue; //an orientation is probably wrong

    if (j->poly2Idx == j->poly1Idx)
    {
      //instead of joining two polygons, we've just created a new one by
      //splitting one polygon into two.
      outRec1->pts = GetBottomPt(p1);
      outRec1->bottomPt = outRec1->pts;
      outRec1->bottomPt->idx = outRec1->idx;
      outRec2 = CreateOutRec();
      m_PolyOuts.push_back(outRec2);
      outRec2->idx = (int)m_PolyOuts.size()-1;
      j->poly2Idx = outRec2->idx;
      outRec2->pts = GetBottomPt(p2);
      outRec2->bottomPt = outRec2->pts;
      outRec2->bottomPt->idx = outRec2->idx;

      if (PointInPolygon(outRec2->pts->pt, outRec1->pts, m_UseFullRange))
      {
        //outRec2 is contained by outRec1 ...
        outRec2->isHole = !outRec1->isHole;
        outRec2->FirstLeft = outRec1;
        if (outRec2->isHole ==
          (m_ReverseOutput ^ Orientation(outRec2, m_UseFullRange)))
            ReversePolyPtLinks(*outRec2->pts);
      } else if (PointInPolygon(outRec1->pts->pt, outRec2->pts, m_UseFullRange))
      {
        //outRec1 is contained by outRec2 ...
        outRec2->isHole = outRec1->isHole;
        outRec1->isHole = !outRec2->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        outRec1->FirstLeft = outRec2;
        if (outRec1->isHole ==
          (m_ReverseOutput ^ Orientation(outRec1, m_UseFullRange)))
            ReversePolyPtLinks(*outRec1->pts);
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      } else
      {
        outRec2->isHole = outRec1->isHole;
        outRec2->FirstLeft = outRec1->FirstLeft;
        //make sure any contained holes now link to the correct polygon ...
        if (fixHoleLinkages) CheckHoleLinkages1(outRec1, outRec2);
      }

      //now fixup any subsequent joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == j->poly1Idx && PointIsVertex(j2->pt1a, p2))
          j2->poly1Idx = j->poly2Idx;
        if (j2->poly2Idx == j->poly1Idx && PointIsVertex(j2->pt2a, p2))
          j2->poly2Idx = j->poly2Idx;
      }

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);
      FixupOutPolygon(*outRec2);

      if (outRec1->pts && (Orientation(outRec1, m_UseFullRange) != (Area(*outRec1, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec1);
      if (outRec2->pts && (Orientation(outRec2, m_UseFullRange) != (Area(*outRec2, m_UseFullRange) > 0)))
          DisposeBottomPt(*outRec2);

    } else
    {
      //joined 2 polygons together ...

      //make sure any holes contained by outRec2 now link to outRec1 ...
      if (fixHoleLinkages) CheckHoleLinkages2(outRec1, outRec2);

      //now cleanup redundant edges too ...
      FixupOutPolygon(*outRec1);

      if (outRec1->pts)
      {
        outRec1->isHole = !Orientation(outRec1, m_UseFullRange);
        if (outRec1->isHole && !outRec1->FirstLeft)
          outRec1->FirstLeft = outRec2->FirstLeft;
      }

      //delete the obsolete pointer ...
      int OKIdx = outRec1->idx;
      int ObsoleteIdx = outRec2->idx;
      outRec2->pts = 0;
      outRec2->bottomPt = 0;
      outRec2->AppendLink = outRec1;

      //now fixup any subsequent Joins that match this polygon
      for (JoinList::size_type k = i+1; k < m_Joins.size(); k++)
      {
        JoinRec* j2 = m_Joins[k];
        if (j2->poly1Idx == ObsoleteIdx) j2->poly1Idx = OKIdx;
        if (j2->poly2Idx == ObsoleteIdx) j2->poly2Idx = OKIdx;
      }
    }
  }
}